

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_builder.h
# Opt level: O2

Instruction * __thiscall
spvtools::opt::InstructionBuilder::AddNaryOp
          (InstructionBuilder *this,uint32_t type_id,Op opcode,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *operands,uint32_t result)

{
  pointer puVar1;
  IRContext *this_00;
  InstructionBuilder *this_01;
  Instruction *pIVar2;
  size_t i;
  ulong uVar3;
  initializer_list<unsigned_int> init_list;
  uint local_b4;
  InstructionBuilder *local_b0;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> ops;
  Operand local_88;
  SmallVector<unsigned_int,_2UL> local_58;
  
  ops.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ops.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ops.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b0 = this;
  for (uVar3 = 0;
      puVar1 = (operands->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start,
      uVar3 < (ulong)((long)(operands->
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                            .super__Vector_impl_data._M_finish - (long)puVar1 >> 2);
      uVar3 = uVar3 + 1) {
    local_b4 = puVar1[uVar3];
    init_list._M_len = 1;
    init_list._M_array = &local_b4;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_58,init_list);
    local_88.type = SPV_OPERAND_TYPE_ID;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_88.words,&local_58);
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
    emplace_back<spvtools::opt::Operand>(&ops,&local_88);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_88.words);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_58);
  }
  pIVar2 = (Instruction *)::operator_new(0x70);
  this_01 = local_b0;
  this_00 = local_b0->context_;
  if (result == 0) {
    result = IRContext::TakeNextId(this_00);
  }
  Instruction::Instruction(pIVar2,this_00,opcode,type_id,result,&ops);
  local_88._0_8_ = pIVar2;
  pIVar2 = AddInstruction(this_01,(unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                                   *)&local_88);
  if ((Instruction *)local_88._0_8_ != (Instruction *)0x0) {
    (*((IntrusiveNodeBase<spvtools::opt::Instruction> *)local_88._0_8_)->_vptr_IntrusiveNodeBase[1])
              ();
  }
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector(&ops);
  return pIVar2;
}

Assistant:

Instruction* AddNaryOp(uint32_t type_id, spv::Op opcode,
                         const std::vector<uint32_t>& operands,
                         uint32_t result = 0) {
    std::vector<Operand> ops;
    for (size_t i = 0; i < operands.size(); i++) {
      ops.push_back({SPV_OPERAND_TYPE_ID, {operands[i]}});
    }
    // TODO(1841): Handle id overflow.
    std::unique_ptr<Instruction> new_inst(new Instruction(
        GetContext(), opcode, type_id,
        result != 0 ? result : GetContext()->TakeNextId(), ops));
    return AddInstruction(std::move(new_inst));
  }